

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.h
# Opt level: O0

void __thiscall rcnb::encoder::encode(encoder *this,istream *istream_in,wostream *ostream_in)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  wchar_t *in_RDX;
  char *in_RSI;
  long in_RDI;
  ulong uVar7;
  long codelength;
  long plainlength;
  wchar_t *code;
  char *plaintext;
  int N;
  wchar_t *in_stack_ffffffffffffff98;
  encoder *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  initialize((encoder *)0x104472);
  iVar1 = *(int *)(in_RDI + 4);
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(iVar1 * 3);
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar7);
  do {
    std::istream::read(in_RSI,(long)pvVar4);
    lVar6 = std::istream::gcount();
    encode((encoder *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
           in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::wostream::write(in_RDX,(long)pvVar5);
    uVar3 = std::ios::good();
    in_stack_ffffffffffffffb7 = (uVar3 & 1) != 0 && 0 < lVar6;
  } while ((bool)in_stack_ffffffffffffffb7);
  encode_end(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::wostream::write(in_RDX,(long)pvVar5);
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void encode(std::istream& istream_in, std::wostream& ostream_in)
    {
        initialize();

        const int N = _buffersize;
        char* plaintext = new char[N];
        auto code = new wchar_t[3 * N];
        long plainlength;
        long codelength;

        do {
            istream_in.read(plaintext, N);
            plainlength = istream_in.gcount();

            codelength = encode(plaintext, plainlength, code);
            ostream_in.write(code, codelength);
        } while (istream_in.good() && plainlength > 0);

        codelength = encode_end(code);
        ostream_in.write(code, codelength);

        delete[] code;
        delete[] plaintext;
    }